

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType electronegativity,
          RealType hardness,int slaterN,RealType slaterZeta)

{
  AtomType *this_00;
  bool bVar1;
  RealType electronegativity_local;
  undefined1 local_b8 [32];
  RealType local_98;
  undefined2 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  RealType local_78;
  RealType local_70;
  int local_68;
  RealType local_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  electronegativity_local = electronegativity;
  bVar1 = isFluctuatingCharge(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  }
  local_90 = 0x100;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88 = 0;
  uStack_80 = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = chargeMass;
  local_78 = electronegativity;
  local_70 = hardness;
  local_68 = slaterN;
  local_60 = slaterZeta;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  Polynomial<double>::setCoefficient((Polynomial<double> *)&local_58,1,&electronegativity_local);
  local_b8._0_8_ = hardness * 0.5;
  Polynomial<double>::setCoefficient((Polynomial<double> *)&local_58,2,(double *)local_b8);
  this_00 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (FluctuatingAtypeParameters *)OpenMD::FQtypeID_abi_cxx11_);
  local_b8._16_8_ = local_b8._0_8_;
  local_b8._24_8_ = local_b8._8_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_b8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(
      RealType chargeMass, RealType electronegativity, RealType hardness,
      int slaterN, RealType slaterZeta) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};
    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = true;

    fqParam.electronegativity = electronegativity;
    fqParam.hardness          = hardness;
    fqParam.slaterN           = slaterN;
    fqParam.slaterZeta        = slaterZeta;

    fqParam.vself.setCoefficient(1, electronegativity);
    fqParam.vself.setCoefficient(2, 0.5 * hardness);

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }